

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall Tetris::rotation(Tetris *this,int o)

{
  bool bVar1;
  uint uVar2;
  int o_00;
  
  if (3 < (uint)o) {
    return false;
  }
  o_00 = this->orientation;
  bVar1 = true;
  if (o_00 != o) {
    bVar1 = isValid(this,-1,-1,o_00);
    do {
      if (bVar1 == false) {
        return false;
      }
      uVar2 = o_00 + 4;
      if (-1 < (int)(o_00 + 1U)) {
        uVar2 = o_00 + 1U;
      }
      o_00 = (o_00 - (uVar2 & 0xfffffffc)) + 1;
      bVar1 = isValid(this,-1,-1,o_00);
    } while (o_00 != o);
  }
  return bVar1;
}

Assistant:

bool Tetris::rotation(int o)
{
    if (o < 0 || o > 3)
        return false;

    if (orientation == o)
        return true;

    int fromO = orientation;
    while (true) {
        if (!isValid(-1, -1, fromO))
            return false;

        if (fromO == o)
            break;

        fromO = (fromO + 1) % 4;
    }
    return true;
}